

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_-1,_1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false,_true>
                  *this,Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *xpr,
                 Index startRow,Index startCol,Index blockRows,Index blockCols)

{
  long lVar1;
  Index IVar2;
  
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_-1,_1,_false>,_0>
  ::MapBase((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,_0>
             *)this,(xpr->
                    super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>
                    .m_data + startCol *
                              (xpr->
                              super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>
                              ).
                              super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                              .m_outerStride + startRow,blockRows,blockCols);
  lVar1 = (xpr->super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_rows.
          m_value;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data =
       (xpr->super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_rows.m_value
       = lVar1;
  IVar2 = (xpr->super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
          m_outerStride;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_xpr =
       (xpr->super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_xpr;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_outerStride =
       IVar2;
  this->m_outerStride =
       (this->m_xpr).
       super_BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.m_outerStride
  ;
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(startRow,startCol)), blockRows, blockCols),
        m_xpr(xpr)
    {
      init();
    }